

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_33c573::BuildEngineImpl::addTaskInputRequest
          (BuildEngineImpl *this,Task *task,KeyType *key,uintptr_t inputID,bool orderOnly,
          bool singleUse)

{
  bool bVar1;
  TaskInfo *pTVar2;
  value_type local_68;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> guard;
  RuleInfo *ruleInfo;
  TaskInfo *taskInfo;
  bool singleUse_local;
  bool orderOnly_local;
  uintptr_t inputID_local;
  KeyType *key_local;
  Task *task_local;
  BuildEngineImpl *this_local;
  
  pTVar2 = getTaskInfo(this,task);
  bVar1 = RuleInfo::isInProgressWaiting(pTVar2->forRuleInfo);
  if (!bVar1) {
    abort();
  }
  guard._M_device = (mutex_type *)getRuleInfoForKey(this,key);
  std::lock_guard<std::mutex>::lock_guard(&local_48,&this->inputRequestsMutex);
  local_68.inputRuleInfo = (RuleInfo *)guard._M_device;
  local_68.forcePriorValue = false;
  local_68.taskInfo = pTVar2;
  local_68.inputID = inputID;
  local_68.orderOnly = orderOnly;
  local_68.singleUse = singleUse;
  std::
  deque<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
  ::push_back(&this->inputRequests,&local_68);
  pTVar2->waitCount = pTVar2->waitCount + 1;
  std::lock_guard<std::mutex>::~lock_guard(&local_48);
  return;
}

Assistant:

void addTaskInputRequest(Task* task, const KeyType& key, uintptr_t inputID, bool orderOnly, bool singleUse) {
    auto taskInfo = getTaskInfo(task);

    // Validate that the task is in a valid state to request inputs.
    if (!taskInfo->forRuleInfo->isInProgressWaiting()) {
      // FIXME: Error handling.
      abort();
    }

    // Lookup the rule for this task.
    RuleInfo* ruleInfo = &getRuleInfoForKey(key);

    std::lock_guard<std::mutex> guard(inputRequestsMutex);
    inputRequests.push_back({ taskInfo, inputID, ruleInfo, orderOnly, false, singleUse });
    taskInfo->waitCount++;
  }